

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs_index.cpp
# Opt level: O2

bool __thiscall
mysqlhs::index::insert
          (index *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *params)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  ostringstream *poVar4;
  pointer pbVar5;
  
  connection::clear(this->conn_);
  poVar4 = &this->conn_->oss;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar3 = std::operator<<((ostream *)poVar4,"\t+\t");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  pbVar1 = (params->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (params->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; poVar4 = &this->conn_->oss,
      pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    std::operator<<((ostream *)poVar4,"\t");
    std::operator<<((ostream *)poVar4,(string *)pbVar5);
  }
  std::operator<<((ostream *)poVar4,"\n");
  bVar2 = connection::query(this->conn_,insert_);
  if (bVar2) {
    bVar2 = connection::is_okay(this->conn_);
    return bVar2;
  }
  return false;
}

Assistant:

bool index::insert(const std::vector<std::string>& params)
	{
		conn_.clear();
		conn_ << index_id_ << "\t+\t" << params.size();

		for (auto& p : params)
		{
			conn_ << "\t" << p;
		}
		conn_ << "\n";

		if (!conn_.query(query_type::insert_) || !conn_.is_okay())
		{
			return false;
		}

		return true;
	}